

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_setfuncs(lua_State *L,luaL_Reg *l,int nup)

{
  int local_20;
  int i;
  int nup_local;
  luaL_Reg *l_local;
  lua_State *L_local;
  
  luaL_checkstack(L,nup,"too many upvalues");
  for (_i = l; _i->name != (char *)0x0; _i = _i + 1) {
    if (_i->func == (lua_CFunction)0x0) {
      lua_pushboolean(L,0);
    }
    else {
      for (local_20 = 0; local_20 < nup; local_20 = local_20 + 1) {
        lua_pushvalue(L,-nup);
      }
      lua_pushcclosure(L,_i->func,nup);
    }
    lua_setfield(L,-(nup + 2),_i->name);
  }
  lua_settop(L,-1 - nup);
  return;
}

Assistant:

LUALIB_API void luaL_setfuncs (lua_State *L, const luaL_Reg *l, int nup) {
  luaL_checkstack(L, nup, "too many upvalues");
  for (; l->name != NULL; l++) {  /* fill the table with given functions */
    if (l->func == NULL)  /* placeholder? */
      lua_pushboolean(L, 0);
    else {
      int i;
      for (i = 0; i < nup; i++)  /* copy upvalues to the top */
        lua_pushvalue(L, -nup);
      lua_pushcclosure(L, l->func, nup);  /* closure with those upvalues */
    }
    lua_setfield(L, -(nup + 2), l->name);
  }
  lua_pop(L, nup);  /* remove upvalues */
}